

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

int __thiscall
crnlib::static_huffman_data_model::init(static_huffman_data_model *this,EVP_PKEY_CTX *ctx)

{
  unsigned_short uVar1;
  uint uVar2;
  int iVar3;
  unsigned_short *puVar4;
  undefined8 extraout_RAX;
  long in_RCX;
  uint in_EDX;
  ulong local_70;
  uint64 fl;
  uint local_60;
  uint f;
  uint i_2;
  uint i_1;
  uint local_48;
  uint local_44;
  uint i;
  uint max_freq;
  vector<unsigned_short> sym_freq16;
  uint code_size_limit_local;
  uint *pSym_freq_local;
  uint total_syms_local;
  bool encoding_local;
  static_huffman_data_model *this_local;
  
  vector<unsigned_short>::vector((vector<unsigned_short> *)&i,in_EDX);
  local_44 = 0;
  for (local_48 = 0; local_48 < in_EDX; local_48 = local_48 + 1) {
    local_44 = math::maximum<unsigned_int>(local_44,*(uint *)(in_RCX + (ulong)local_48 * 4));
  }
  if (local_44 == 0) {
    this_local._7_1_ = 0;
  }
  else {
    if (local_44 < 0x10000) {
      for (f = 0; f < in_EDX; f = f + 1) {
        uVar1 = *(unsigned_short *)(in_RCX + (ulong)f * 4);
        puVar4 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)&i,f);
        *puVar4 = uVar1;
      }
    }
    else {
      for (local_60 = 0; local_60 < in_EDX; local_60 = local_60 + 1) {
        uVar2 = *(uint *)(in_RCX + (ulong)local_60 * 4);
        if (uVar2 != 0) {
          local_70 = ((ulong)uVar2 * 0xffff + (ulong)(local_44 >> 1)) / (ulong)local_44;
          if (local_70 == 0) {
            local_70 = 1;
          }
          puVar4 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)&i,local_60);
          *puVar4 = (unsigned_short)local_70;
        }
      }
    }
    vector<unsigned_short>::operator[]((vector<unsigned_short> *)&i,0);
    iVar3 = init(this,(EVP_PKEY_CTX *)(ulong)((byte)ctx & 1));
    this_local._7_1_ = (byte)iVar3 & 1;
  }
  vector<unsigned_short>::~vector((vector<unsigned_short> *)&i);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_);
}

Assistant:

bool static_huffman_data_model::init(bool encoding, uint total_syms, const uint* pSym_freq, uint code_size_limit)
    {
        CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms) && (code_size_limit >= 1));

        crnlib::vector<uint16> sym_freq16(total_syms);

        uint max_freq = 0;
        for (uint i = 0; i < total_syms; i++)
        {
            max_freq = math::maximum(max_freq, pSym_freq[i]);
        }

        if (!max_freq)
        {
            return false;
        }

        if (max_freq <= cUINT16_MAX)
        {
            for (uint i = 0; i < total_syms; i++)
            {
                sym_freq16[i] = static_cast<uint16>(pSym_freq[i]);
            }
        }
        else
        {
            for (uint i = 0; i < total_syms; i++)
            {
                uint f = pSym_freq[i];
                if (!f)
                {
                    continue;
                }

                uint64 fl = f;

                fl = ((fl << 16) - fl) + (max_freq >> 1);
                fl /= max_freq;
                if (fl < 1)
                {
                    fl = 1;
                }

                CRNLIB_ASSERT(fl <= cUINT16_MAX);

                sym_freq16[i] = static_cast<uint16>(fl);
            }
        }

        return init(encoding, total_syms, &sym_freq16[0], code_size_limit);
    }